

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlRegFreeAtom(xmlRegAtomPtr atom)

{
  int local_14;
  int i;
  xmlRegAtomPtr atom_local;
  
  if (atom != (xmlRegAtomPtr)0x0) {
    for (local_14 = 0; local_14 < atom->nbRanges; local_14 = local_14 + 1) {
      xmlRegFreeRange(atom->ranges[local_14]);
    }
    if (atom->ranges != (xmlRegRangePtr *)0x0) {
      (*xmlFree)(atom->ranges);
    }
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep != (void *)0x0)) {
      (*xmlFree)(atom->valuep);
    }
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep2 != (void *)0x0)) {
      (*xmlFree)(atom->valuep2);
    }
    if ((atom->type == XML_REGEXP_BLOCK_NAME) && (atom->valuep != (void *)0x0)) {
      (*xmlFree)(atom->valuep);
    }
    (*xmlFree)(atom);
  }
  return;
}

Assistant:

static void
xmlRegFreeAtom(xmlRegAtomPtr atom) {
    int i;

    if (atom == NULL)
	return;

    for (i = 0;i < atom->nbRanges;i++)
	xmlRegFreeRange(atom->ranges[i]);
    if (atom->ranges != NULL)
	xmlFree(atom->ranges);
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep != NULL))
	xmlFree(atom->valuep);
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep2 != NULL))
	xmlFree(atom->valuep2);
    if ((atom->type == XML_REGEXP_BLOCK_NAME) && (atom->valuep != NULL))
	xmlFree(atom->valuep);
    xmlFree(atom);
}